

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O1

bool __thiscall crnlib::vector<float>::try_resize(vector<float> *this,uint new_size,bool grow_hint)

{
  uint uVar1;
  bool bVar2;
  
  uVar1 = this->m_size;
  if (uVar1 != new_size) {
    if (uVar1 <= new_size) {
      if ((this->m_capacity < new_size) &&
         (bVar2 = elemental_vector::increase_capacity
                            ((elemental_vector *)this,new_size,uVar1 + 1 == new_size || grow_hint,4,
                             (object_mover)0x0,true), !bVar2)) {
        return false;
      }
      memset(this->m_p + this->m_size,0,(ulong)(new_size - this->m_size) << 2);
    }
    this->m_size = new_size;
  }
  return true;
}

Assistant:

inline bool try_resize(uint new_size, bool grow_hint = false) {
    if (m_size != new_size) {
      if (new_size < m_size)
        scalar_type<T>::destruct_array(m_p + new_size, m_size - new_size);
      else {
        if (new_size > m_capacity) {
          if (!increase_capacity(new_size, (new_size == (m_size + 1)) || grow_hint, true))
            return false;
        }

        scalar_type<T>::construct_array(m_p + m_size, new_size - m_size);
      }

      m_size = new_size;
    }

    return true;
  }